

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O2

int ffmcrd(fitsfile *fptr,char *keyname,char *card,int *status)

{
  FITSfile *pFVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  undefined8 uStack_200;
  char value [81];
  char valstring [81];
  char tcard [81];
  char nextcomm [73];
  char comm [81];
  
  if (0 < *status) {
    return *status;
  }
  uStack_200 = 0x19368c;
  iVar4 = ffgcrd(fptr,keyname,tcard,status);
  if (iVar4 < 1) {
    uStack_200 = 0x1936a2;
    ffmkey(fptr,card,status);
    pFVar1 = fptr->Fptr;
    lVar2 = pFVar1->nextkey;
    lVar3 = pFVar1->headstart[pFVar1->curhdu];
    uStack_200 = 0x1936e1;
    ffpsvc(tcard,valstring,comm,status);
    iVar4 = *status;
    if (iVar4 < 1) {
      uStack_200 = 0x1936ec;
      ffpmrk();
      uStack_200 = 0x1936ff;
      ffc2s(valstring,value,status);
      if (*status != 0xcc) {
        do {
          uStack_200 = 0x193735;
          sVar5 = strlen(value);
          do {
            if (((int)sVar5 == 0) || (value[(long)(int)sVar5 + -1] != '&')) goto LAB_00193690;
            uStack_200 = 0x19375c;
            ffgcnt(fptr,value,nextcomm,status);
            sVar5 = 0;
          } while (value[0] == '\0');
          uStack_200 = 0x193772;
          ffdrec(fptr,(int)((lVar2 - lVar3) / 0x50) + 1,status);
        } while( true );
      }
      uStack_200 = 0x19370c;
      ffcmrk();
      *status = 0;
      iVar4 = 0;
    }
  }
  else {
LAB_00193690:
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int ffmcrd(fitsfile *fptr,      /* I - FITS file pointer  */
           const char *keyname, /* I - keyword name       */
           const char *card,    /* I - card string value  */
           int *status)         /* IO - error status      */
{
    char tcard[FLEN_CARD], valstring[FLEN_CARD], comm[FLEN_CARD], value[FLEN_CARD];
    char nextcomm[FLEN_COMMENT];
    int keypos, len;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgcrd(fptr, keyname, tcard, status) > 0)
        return(*status);

    ffmkey(fptr, card, status);

    /* calc position of keyword in header */
    keypos = (int) ((((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu])) / 80) + 1;

    ffpsvc(tcard, valstring, comm, status);

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check for string value which may be continued over multiple keywords */
    ffpmrk(); /* put mark on message stack; erase any messages after this */
    ffc2s(valstring, value, status);   /* remove quotes and trailing spaces */

    if (*status == VALUE_UNDEFINED) {
       ffcmrk();  /* clear any spurious error messages, back to the mark */
       *status = 0;
    } else {
 
      len = strlen(value);

      while (len && value[len - 1] == '&')  /* ampersand used as continuation char */
      {
        ffgcnt(fptr, value, nextcomm, status);
        if (*value)
        {
            ffdrec(fptr, keypos, status);  /* delete the keyword */
            len = strlen(value);
        }
        else   /* a null valstring indicates no continuation */
            len = 0;
      }
    }

    return(*status);
}